

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON_writer.hh
# Opt level: O2

Writer * __thiscall JSON::Writer::writeNext(Writer *this)

{
  char *pcVar1;
  ulong uVar2;
  long lStack_30;
  
  uVar2 = this->indent;
  if (this->first == true) {
    this->first = false;
    pcVar1 = "\n                                                  ";
    lStack_30 = 1;
  }
  else {
    pcVar1 = ",\n                                                  ";
    lStack_30 = 2;
  }
  (*this->p->_vptr_Pipeline[2])(this->p,pcVar1,uVar2 % 0x32 + lStack_30);
  for (; 0x31 < uVar2; uVar2 = uVar2 - 0x32) {
    (*this->p->_vptr_Pipeline[2])(this->p,"                                                  ",0x32)
    ;
  }
  return this;
}

Assistant:

Writer&
    writeNext()
    {
        auto n = indent;
        if (first) {
            first = false;
            write(&spaces[1], n % n_spaces + 1);
        } else {
            write(&spaces[0], n % n_spaces + 2);
        }
        while (n >= n_spaces) {
            write(&spaces[2], n_spaces);
            n -= n_spaces;
        }
        return *this;
    }